

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdate.cpp
# Opt level: O1

int CVmObjDate::common_parseDate(vm_val_t *retval,uint *oargc,multicaldate_t *cal)

{
  CVmObjPageEntry *pCVar1;
  CVmObjPageEntry *this;
  int iVar2;
  anon_union_8_8_cb74652f_for_val aVar3;
  undefined4 uVar4;
  vm_val_t *pvVar5;
  int iVar6;
  vm_obj_id_t vVar7;
  char *pcVar8;
  CVmTimeZone *reftz;
  ulong uVar9;
  uint reftime;
  uint uVar10;
  uint uVar11;
  long lVar12;
  date_parse_string *fmtlist;
  int fmt_match_cnt;
  uint local_2d4;
  vm_val_t ele;
  int32_t daytime;
  int32_t dayno;
  ulong local_2b8;
  vm_val_t *local_2b0;
  char *local_2a8;
  CVmDateLocale lc;
  long ns;
  int local_288;
  int iStack_284;
  int iStack_280;
  int iStack_27c;
  int local_278;
  int iStack_274;
  int iStack_270;
  int iStack_26c;
  int local_268;
  int iStack_264;
  int local_260;
  CVmTimeZone *local_258;
  int local_250;
  date_parse_string local_248;
  date_parse_string local_238;
  date_parse_string local_228;
  date_parse_string local_218;
  date_parse_string local_208;
  date_parse_string local_1f8;
  date_parse_string local_1e8;
  date_parse_string local_1d8;
  date_parse_string local_1c8;
  date_parse_string local_1b8;
  date_parse_string local_1a8;
  date_parse_string local_198;
  date_parse_string local_188;
  date_parse_string fmt_match [20];
  
  if (oargc == (uint *)0x0) {
    uVar10 = 0;
  }
  else {
    uVar10 = *oargc;
  }
  if (common_parseDate(vm_val_t*,unsigned_int*,multicaldate_t*)::desc == '\0') {
    common_parseDate();
  }
  iVar6 = CVmObject::get_prop_check_argc(retval,oargc,&common_parseDate::desc);
  if (iVar6 == 0) {
    CVmDateLocale::CVmDateLocale(&lc);
    local_2a8 = vm_val_t::get_as_string(sp_ + -1);
    if (local_2a8 == (char *)0x0) {
      err_throw(0x902);
    }
    if (uVar10 < 2) {
      local_2b0 = (vm_val_t *)0x0;
    }
    else {
      local_2b0 = (vm_val_t *)0x0;
      if (sp_[-2].typ != VM_NIL) {
        local_2b0 = sp_ + -2;
      }
    }
    if ((uVar10 < 3) || (sp_[-3].typ == VM_NIL)) {
      os_time_ns((time_t *)fmt_match,&ns);
      iVar6 = (int)(SUB168(SEXT816((long)fmt_match[0].p) * SEXT816(0x1845c8a0ce512957),8) >> 0xd);
      iVar2 = SUB164(SEXT816((long)fmt_match[0].p) * SEXT816(0x1845c8a0ce512957),0xc) >> 0x1f;
      uVar11 = (iVar6 - iVar2) + 0xafa6c;
      reftime = ((int)(SUB168(SEXT816(0x431bde82d7b634db) * SEXT816(ns),8) >> 0x12) -
                (SUB164(SEXT816(0x431bde82d7b634db) * SEXT816(ns),0xc) >> 0x1f)) +
                ((int)fmt_match[0].p + (iVar6 - iVar2) * -0x15180) * 1000;
    }
    else {
      if ((sp_[-3].typ == VM_OBJ) &&
         (iVar6 = (**(code **)(*(long *)&G_obj_table_X.pages_[sp_[-3].val.obj >> 0xc]
                                         [sp_[-3].val.obj & 0xfff].ptr_ + 8))
                            (G_obj_table_X.pages_[sp_[-3].val.obj >> 0xc] +
                             (sp_[-3].val.obj & 0xfff),metaclass_reg_), iVar6 != 0)) {
        pcVar8 = (G_obj_table_X.pages_[sp_[-3].val.obj >> 0xc]->ptr_).obj_ +
                 (sp_[-3].val.obj & 0xfff) * 0x18;
      }
      else {
        pcVar8 = (char *)0x0;
      }
      if (pcVar8 == (char *)0x0) {
        err_throw(0x900);
      }
      uVar11 = **(uint **)(pcVar8 + 8);
      reftime = (*(uint **)(pcVar8 + 8))[1];
    }
    local_2b8 = (ulong)uVar11;
    local_2d4 = uVar10;
    reftz = get_tz_arg(3,uVar10);
    memset(&local_248,0,0xd0);
    local_288 = 0;
    iStack_284 = -0x80000000;
    iStack_280 = -0x80000000;
    iStack_27c = -0x80000000;
    local_268 = -0x80000000;
    iStack_264 = -0x80000000;
    local_260 = -0x80000000;
    local_250 = -0x80000000;
    local_278 = -0x80000000;
    iStack_274 = 0;
    iStack_270 = 0;
    iStack_26c = -0x80000000;
    local_258 = (CVmTimeZone *)0x0;
    fmtlist = fmt_match;
    ns = (long)cal;
    memset(fmtlist,0,0x140);
    fmt_match_cnt = 0x14;
    iVar6 = parse_date_string(&dayno,&daytime,local_2a8,local_2b0,&lc,cal,(int32_t)local_2b8,reftime
                              ,reftz,(date_parse_result *)&ns,fmtlist,&fmt_match_cnt);
    if (iVar6 == 0) {
      retval->typ = VM_NIL;
    }
    else {
      vVar7 = CVmObjList::create(0,5);
      retval->typ = VM_OBJ;
      (retval->val).obj = vVar7;
      pvVar5 = sp_;
      uVar4 = *(undefined4 *)&retval->field_0x4;
      aVar3 = retval->val;
      sp_ = sp_ + 1;
      pvVar5->typ = retval->typ;
      *(undefined4 *)&pvVar5->field_0x4 = uVar4;
      pvVar5->val = aVar3;
      pCVar1 = G_obj_table_X.pages_[(retval->val).obj >> 0xc] + ((retval->val).obj & 0xfff);
      uVar9 = (ulong)**(ushort **)((long)&pCVar1->ptr_ + 8);
      if (uVar9 != 0) {
        CVmObjList::cons_clear((CVmObjList *)pCVar1,0,uVar9 - 1);
      }
      ele.val.obj = create(0,dayno,daytime);
      ele.typ = VM_OBJ;
      CVmObjList::cons_set_element((CVmObjList *)pCVar1,0,&ele);
      ele.typ = VM_NIL;
      if (local_258 != reftz) {
        ele.val.obj = CVmObjTimeZone::create(local_258);
        ele.typ = VM_OBJ;
      }
      CVmObjList::cons_set_element((CVmObjList *)pCVar1,1,&ele);
      uVar10 = local_2d4;
      ele.val.intval = local_250 / 1000;
      ele.typ = VM_INT;
      CVmObjList::cons_set_element((CVmObjList *)pCVar1,2,&ele);
      ele.val.obj = CVmObjList::create(0,(long)fmt_match_cnt);
      ele.typ = VM_OBJ;
      CVmObjList::cons_set_element((CVmObjList *)pCVar1,3,&ele);
      this = G_obj_table_X.pages_[ele.val.obj >> 0xc] + (ele.val.obj & 0xfff);
      uVar9 = (ulong)**(ushort **)((long)&this->ptr_ + 8);
      if (uVar9 != 0) {
        CVmObjList::cons_clear((CVmObjList *)this,0,uVar9 - 1);
      }
      if (0 < fmt_match_cnt) {
        lVar12 = 0;
        do {
          enlist_str((CVmObjList *)this,(int)lVar12,fmtlist);
          lVar12 = lVar12 + 1;
          fmtlist = fmtlist + 1;
        } while (lVar12 < fmt_match_cnt);
      }
      ele.val.obj = CVmObjList::create(0,0xd);
      ele.typ = VM_OBJ;
      CVmObjList::cons_set_element((CVmObjList *)pCVar1,4,&ele);
      pCVar1 = G_obj_table_X.pages_[ele.val.obj >> 0xc] + (ele.val.obj & 0xfff);
      uVar9 = (ulong)**(ushort **)((long)&pCVar1->ptr_ + 8);
      if (uVar9 != 0) {
        CVmObjList::cons_clear((CVmObjList *)pCVar1,0,uVar9 - 1);
      }
      enlist_str((CVmObjList *)pCVar1,0,&local_248);
      enlist_str((CVmObjList *)pCVar1,1,&local_238);
      enlist_str((CVmObjList *)pCVar1,2,&local_228);
      enlist_str((CVmObjList *)pCVar1,3,&local_218);
      enlist_str((CVmObjList *)pCVar1,4,&local_208);
      enlist_str((CVmObjList *)pCVar1,5,&local_1f8);
      enlist_str((CVmObjList *)pCVar1,6,&local_1e8);
      enlist_str((CVmObjList *)pCVar1,7,&local_1d8);
      enlist_str((CVmObjList *)pCVar1,8,&local_1c8);
      enlist_str((CVmObjList *)pCVar1,9,&local_1b8);
      enlist_str((CVmObjList *)pCVar1,10,&local_1a8);
      enlist_str((CVmObjList *)pCVar1,0xb,&local_198);
      enlist_str((CVmObjList *)pCVar1,0xc,&local_188);
      sp_ = sp_ + -1;
      local_2d4 = uVar10;
    }
    sp_ = sp_ + -(long)(int)local_2d4;
  }
  return 1;
}

Assistant:

int CVmObjDate::common_parseDate(VMG_ vm_val_t *retval, uint *oargc,
                                 multicaldate_t *cal)
{
    /* check arguments */
    uint argc = (oargc != 0 ? *oargc : 0);
    static CVmNativeCodeDesc desc(1, 3, FALSE);
    if (get_prop_check_argc(retval, oargc, &desc))
        return TRUE;

    /* set up a locale state interface */
    CVmDateLocale lc Pvmg0_P;

    /* retrieve the string to parse */
    const char *src = G_stk->get(0)->get_as_string(vmg0_);
    if (src == 0)
        err_throw(VMERR_BAD_VAL_BIF);

    /* retrieve the format string/list argument, if present */
    const vm_val_t *custom = 0;
    if (argc >= 2 && G_stk->get(1)->typ != VM_NIL)
        custom = G_stk->get(1);

    /* retrieve the reference date, if present */
    int32_t refday, reftime;
    if (argc >= 3 && G_stk->get(2)->typ != VM_NIL)
    {
        /* get the reference date */
        CVmObjDate *refdate = vm_val_cast(CVmObjDate, G_stk->get(2));
        if (refdate == 0)
            err_throw(VMERR_BAD_TYPE_BIF);

        /* get its contents */
        refday = refdate->get_ext()->dayno;
        reftime = refdate->get_ext()->daytime;
    }
    else
    {
        /* no reference date argument - get the current date and time */
        caldate_t::now(refday, reftime);
    }

    /* retrieve the reference time zone, if present */
    CVmTimeZone *reftz = get_tz_arg(vmg_ 3, argc);

    /* parse the date */
    int32_t dayno, daytime;
    date_parse_result result(cal);
    date_parse_string fmt_match[20];
    int fmt_match_cnt = countof(fmt_match);
    if (parse_date_string(vmg_ dayno, daytime, src, custom, &lc,
                          cal, refday, reftime, reftz, &result,
                          fmt_match, &fmt_match_cnt))
    {
        /* create the return list */
        retval->set_obj(CVmObjList::create(vmg_ FALSE, 5));
        G_stk->push(retval);
        CVmObjList *lst = (CVmObjList *)vm_objp(vmg_ retval->val.obj);
        lst->cons_clear();

        /* element [1] is the return date */
        vm_val_t ele;
        ele.set_obj(CVmObjDate::create(vmg_ FALSE, dayno, daytime));
        lst->cons_set_element(0, &ele);

        /* [2] is the TimeZone object, if applicable */
        ele.set_nil();
        if (result.tz != reftz)
            ele.set_obj(CVmObjTimeZone::create(vmg_ result.tz));
        lst->cons_set_element(1, &ele);

        /* [3] is the fixed timezone offset in seconds, if applicable */
        ele.set_nil();
        if (result.has_tzofs())
            ele.set_int(result.tzofs / 1000);
        lst->cons_set_element(2, &ele);

        /* [4] next is the format string matched */
        ele.set_obj(CVmObjList::create(vmg_ FALSE, fmt_match_cnt));
        lst->cons_set_element(3, &ele);
        CVmObjList *flst = (CVmObjList *)vm_objp(vmg_ ele.val.obj);
        flst->cons_clear();

        /* populate the format string list */
        for (int fi = 0 ; fi < fmt_match_cnt ; ++fi)
            enlist_str(vmg_ flst, fi, fmt_match[fi]);

        /* [5] is a sublist with the source substrings */
        ele.set_obj(CVmObjList::create(vmg_ FALSE, 13));
        lst->cons_set_element(4, &ele);
        CVmObjList *slst = (CVmObjList *)vm_objp(vmg_ ele.val.obj);
        slst->cons_clear();

        /* now add the date component source strings */
        enlist_str(vmg_ slst, 0, result.pera);
        enlist_str(vmg_ slst, 1, result.pyy);
        enlist_str(vmg_ slst, 2, result.pmm);
        enlist_str(vmg_ slst, 3, result.pdd);
        enlist_str(vmg_ slst, 4, result.pdoy);
        enlist_str(vmg_ slst, 5, result.pw);
        enlist_str(vmg_ slst, 6, result.pampm);
        enlist_str(vmg_ slst, 7, result.phh);
        enlist_str(vmg_ slst, 8, result.pmi);
        enlist_str(vmg_ slst, 9, result.pss);
        enlist_str(vmg_ slst, 10, result.pms);
        enlist_str(vmg_ slst, 11, result.punix);
        enlist_str(vmg_ slst, 12, result.ptz);

        /* done with the list gc protection */
        G_stk->discard();
    }
    else
    {
        /* return nil */
        retval->set_nil();
    }

    /* discard arguments */
    G_stk->discard(argc);

    /* handled */
    return TRUE;
}